

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpTestLog.c
# Opt level: O3

deBool qpTestLog_writeValueInteger(qpTestLog *log,deInt64 value)

{
  deBool dVar1;
  char tmpString [64];
  char acStack_58 [64];
  
  deSprintf(acStack_58,0x20,"%lld",value);
  deMutex_lock(log->lock);
  dVar1 = qpXmlWriter_writeStringElement(log->writer,"Value",acStack_58);
  if (dVar1 == 0) {
    qpPrintf("qpTestLog_writeSampleValue(): Writing XML failed\n");
  }
  deMutex_unlock(log->lock);
  return (uint)(dVar1 != 0);
}

Assistant:

deBool qpTestLog_writeValueInteger (qpTestLog* log, deInt64 value)
{
	char tmpString[64];
	int64ToString(value, tmpString);

	deMutex_lock(log->lock);

	DE_ASSERT(ContainerStack_getTop(&log->containerStack) == CONTAINERTYPE_SAMPLE);

	if (!qpXmlWriter_writeStringElement(log->writer, "Value", &tmpString[0]))
	{
		qpPrintf("qpTestLog_writeSampleValue(): Writing XML failed\n");
		deMutex_unlock(log->lock);
		return DE_FALSE;
	}

	deMutex_unlock(log->lock);
	return DE_TRUE;
}